

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::default_cost_type<float>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (default_cost_type<float> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  float min;
  pointer end;
  default_cost_type<float> *pdVar1;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  _Var2;
  float *pfVar3;
  int i;
  ulong uVar4;
  ulong uVar5;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  end_00;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  begin;
  pointer ppVar6;
  float fVar7;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> r;
  allocator_type local_59;
  _Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> local_58;
  size_type local_40;
  default_cost_type<float> *local_38;
  
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::vector
            ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)&local_58,
             (long)n,&local_59);
  pfVar3 = (this->linear_elements)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
           _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  uVar5 = (ulong)(uint)n;
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    local_58._M_impl.super__Vector_impl_data._M_start[uVar4].first = pfVar3[uVar4];
    local_58._M_impl.super__Vector_impl_data._M_start[uVar4].second = (int)uVar4;
  }
  local_40 = (long)n;
  local_38 = this;
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<float>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
            (local_58._M_impl.super__Vector_impl_data._M_start,
             local_58._M_impl.super__Vector_impl_data._M_finish);
  end = local_58._M_impl.super__Vector_impl_data._M_finish;
  begin._M_current = local_58._M_impl.super__Vector_impl_data._M_start;
  ppVar6 = local_58._M_impl.super__Vector_impl_data._M_start;
  for (end_00._M_current = local_58._M_impl.super__Vector_impl_data._M_start;
      end_00._M_current != end; end_00._M_current = end_00._M_current + 1) {
    fVar7 = (end_00._M_current)->first;
    min = (begin._M_current)->first;
    if (((fVar7 != min) || (_Var2._M_current = begin._M_current, NAN(fVar7) || NAN(min))) &&
       (_Var2._M_current = end_00._M_current, 8 < (long)ppVar6 - (long)begin._M_current)) {
      random_epsilon_unique<float,__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>>
                (begin,end_00,rng,min,fVar7);
    }
    ppVar6 = ppVar6 + 1;
    begin._M_current = _Var2._M_current;
  }
  if (8 < (long)end - (long)begin._M_current) {
    if ((long)begin._M_current - (long)local_58._M_impl.super__Vector_impl_data._M_start == 0) {
      random_epsilon_unique<float,__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>>
                (begin,(__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                        )end,rng,(begin._M_current)->first,(begin._M_current)->first + 1.0);
    }
    else {
      fVar7 = linearize<long,float>
                        (0,(local_58._M_impl.super__Vector_impl_data._M_start)->first,
                         (long)begin._M_current -
                         (long)local_58._M_impl.super__Vector_impl_data._M_start >> 3,
                         (begin._M_current)->first,
                         (long)local_58._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_58._M_impl.super__Vector_impl_data._M_start >> 3);
      random_epsilon_unique<float,__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>>
                (begin,(__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                        )end,rng,(begin._M_current)->first,fVar7);
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::default_cost_type<float>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
            (local_58._M_impl.super__Vector_impl_data._M_start,
             local_58._M_impl.super__Vector_impl_data._M_finish);
  pdVar1 = local_38;
  pfVar3 = (local_38->linear_elements)._M_t.
           super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pfVar3[uVar4] = local_58._M_impl.super__Vector_impl_data._M_start[uVar4].first;
  }
  pfVar3 = std::__max_element<float*,__gnu_cxx::__ops::_Iter_less_iter>(pfVar3,pfVar3 + local_40);
  fVar7 = *pfVar3;
  if ((int)ABS(fVar7) - 0x800000U < 0x7f000000) {
    pfVar3 = (pdVar1->linear_elements)._M_t.
             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      pfVar3[uVar4] = pfVar3[uVar4] / fVar7;
    }
  }
  std::_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::~_Vector_base
            (&local_58);
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        auto begin = r.begin();
        auto end = r.end();
        auto next = r.begin()++;
        for (; next != end; ++next) {
            if (next->first != begin->first) {
                if (std::distance(begin, next) > 1)
                    random_epsilon_unique(
                      begin, next, rng, begin->first, next->first);

                begin = next;
            }
        }

        if (std::distance(begin, end) > 1) {
            if (begin == r.begin()) {
                random_epsilon_unique(
                  begin, end, rng, begin->first, begin->first + 1);
            } else {
                auto value = linearize(std::ptrdiff_t(0),
                                       r.front().first,
                                       std::distance(r.begin(), begin),
                                       begin->first,
                                       std::distance(r.begin(), r.end()));

                random_epsilon_unique(begin, end, rng, begin->first, value);
            }
        }

        // Reorder the vector according to the variable index, so, it
        // restores the initial order.

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.second < rhs.second;
        });

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;

        // Finally we compute the l+oo norm.

        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);
        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }